

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

int loader_impl_initialize(plugin_manager manager,plugin p,loader_impl impl)

{
  set s;
  int iVar1;
  char *pcVar2;
  value pvVar3;
  size_t length;
  undefined8 *puVar4;
  loader_impl_data pvVar5;
  void *pvVar6;
  size_t sVar7;
  void *pvVar8;
  loader_impl_interface iface;
  vector pvVar9;
  configuration config;
  char *pcVar10;
  size_t sVar11;
  
  if (impl->init == 0) {
    return 0;
  }
  pcVar2 = plugin_manager_library_path(manager);
  if ((impl->config == (configuration)0x0) ||
     (pvVar3 = configuration_value_type(impl->config,"loader_library_path",7), pvVar3 != (value)0x0)
     ) {
    pvVar3 = (value)0x0;
  }
  else {
    length = strnlen(pcVar2,0x1000);
    pvVar3 = value_create_string(pcVar2,length);
    configuration_define(impl->config,"loader_library_path",pvVar3);
  }
  puVar4 = (undefined8 *)plugin_iface(p);
  pvVar5 = (loader_impl_data)(*(code *)*puVar4)(impl,impl->config);
  impl->data = pvVar5;
  if (pvVar3 != (value)0x0 && impl->config != (configuration)0x0) {
    configuration_undefine(impl->config,"loader_library_path");
    value_type_destroy(pvVar3);
    pvVar5 = impl->data;
  }
  if (pvVar5 == (loader_impl_data)0x0) {
    pcVar2 = plugin_name(p);
    pcVar10 = "Loader (%s) returned NULL value on the initialization";
    sVar7 = 0x1b2;
  }
  else {
    pvVar6 = plugin_manager_impl(manager);
    sVar7 = vector_size(*(vector *)((long)pvVar6 + 8));
    if (sVar7 != 0) {
      sVar11 = 0;
      do {
        pvVar8 = vector_at(*(vector *)((long)pvVar6 + 8),sVar11);
        if (*(plugin *)((long)pvVar8 + 8) == p) {
          impl->init = 0;
          if (impl->config == (configuration)0x0) {
            config = (configuration)0x0;
          }
          else {
            iface = (loader_impl_interface)plugin_iface(p);
            loader_impl_configuration_execution_paths(iface,impl);
            config = impl->config;
          }
          pvVar3 = configuration_value_type(config,"loader_library_path",7);
          if (pvVar3 != (value)0x0) {
            pcVar2 = value_to_string(pvVar3);
          }
          iVar1 = loader_impl_execution_path(p,impl,pcVar2);
          if (iVar1 != 0) {
            log_write_impl_va("metacall",0x1d7,"loader_impl_initialize",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                              ,LOG_LEVEL_ERROR,"Error when loading path %s",pcVar2);
          }
          pvVar6 = plugin_manager_impl(manager);
          pvVar9 = *(vector *)((long)pvVar6 + 0x18);
          if ((pvVar9 != (vector)0x0) && (sVar7 = vector_size(pvVar9), sVar7 != 0)) {
            sVar11 = 0;
            do {
              puVar4 = (undefined8 *)vector_at(pvVar9,sVar11);
              pcVar2 = (char *)*puVar4;
              iVar1 = loader_impl_execution_path(p,impl,pcVar2);
              if (iVar1 != 0) {
                pcVar10 = plugin_name(p);
                log_write_impl_va("metacall",0x1e7,"loader_impl_initialize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                  ,LOG_LEVEL_ERROR,"Loader (%s) failed to define execution path: %s"
                                  ,pcVar10,pcVar2);
              }
              sVar11 = sVar11 + 1;
            } while (sVar7 != sVar11);
          }
          s = impl->exec_path_map;
          pcVar2 = plugin_name(p);
          pvVar9 = (vector)set_get(s,pcVar2);
          if (pvVar9 != (vector)0x0) {
            sVar7 = vector_size(pvVar9);
            if (sVar7 != 0) {
              sVar11 = 0;
              do {
                pcVar2 = (char *)vector_at(pvVar9,sVar11);
                iVar1 = loader_impl_execution_path(p,impl,pcVar2);
                if (iVar1 != 0) {
                  pcVar10 = plugin_name(p);
                  log_write_impl_va("metacall",0x1f9,"loader_impl_initialize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                    ,LOG_LEVEL_ERROR,"Loader (%s) failed to load path: %s",pcVar10,
                                    pcVar2);
                }
                sVar11 = sVar11 + 1;
              } while (sVar7 != sVar11);
              return 0;
            }
            return 0;
          }
          return 0;
        }
        sVar11 = sVar11 + 1;
      } while (sVar7 != sVar11);
    }
    pcVar2 = plugin_name(p);
    plugin_name(p);
    pcVar10 = 
    "Loader (%s) was not registered in the initialization list, in order to solve this problem it must call to the function \'loader_initialization_register\' at the end of the initialization (i.e %s_loader_impl_initialize)"
    ;
    sVar7 = 0x1bc;
  }
  log_write_impl_va("metacall",sVar7,"loader_impl_initialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                    ,LOG_LEVEL_ERROR,pcVar10,pcVar2);
  return 1;
}

Assistant:

int loader_impl_initialize(plugin_manager manager, plugin p, loader_impl impl)
{
	static const char loader_library_path[] = "loader_library_path";
	value loader_library_path_value = NULL;
	char *library_path = NULL;
	vector script_paths, paths;

	if (impl->init == 0)
	{
		return 0;
	}

	/* Retrieve the library path */
	library_path = plugin_manager_library_path(manager);

	/* The library path priority order is the following:
	* 1) In the configuration <tag>_loader.json, the flag loader_library_path.
	* 2) The environment variable LOADER_LIBRARY_PATH.
	* 3) The directory of the path of (lib)metacall.{so,dll,dylib,...}
	* 4) Default install paths defined at compile time.
	*/

	/* Check if the configuration has a custom loader_library_path, otherwise set it up */
	if (impl->config != NULL && configuration_value_type(impl->config, loader_library_path, TYPE_STRING) == NULL)
	{
		loader_library_path_value = value_create_string(library_path, strnlen(library_path, LOADER_PATH_SIZE));
		configuration_define(impl->config, loader_library_path, loader_library_path_value);
	}

	/* Call to the loader initialize method */
	impl->data = loader_iface(p)->initialize(impl, impl->config);

	/* Undefine the library path field from config */
	if (impl->config != NULL && loader_library_path_value != NULL)
	{
		configuration_undefine(impl->config, loader_library_path);
		value_type_destroy(loader_library_path_value);
	}

	/* Verify that it the loader returned valid data on initialization */
	if (impl->data == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) returned NULL value on the initialization", plugin_name(p));
		return 1;
	}

	/* Verify that the loader has been registered into the initialization list */
	if (loader_impl_initialize_registered(manager, p) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) was not registered in the initialization list, "
											   "in order to solve this problem it must call to the function 'loader_initialization_register' "
											   "at the end of the initialization (i.e %s_loader_impl_initialize)",
			plugin_name(p), plugin_name(p));
		return 1;
	}

	impl->init = 0;

	if (impl->config != NULL)
	{
		loader_impl_configuration_execution_paths(loader_iface(p), impl);
	}

	/* The scripts path priority order is the following:
	* 1) The library path.
	* 2) The delimiter based paths defined in LOADER_SCRIPT_PATH.
	* 3) The execution paths defined before the initialization of a loader (for example, all metacall_execution_path(...) called before metacall_load_from_file(...)).
	*/

	/* Load the library path as execution path */
	loader_library_path_value = configuration_value_type(impl->config, loader_library_path, TYPE_STRING);

	if (loader_library_path_value != NULL)
	{
		library_path = value_to_string(loader_library_path_value);
	}

	if (loader_impl_execution_path(p, impl, library_path) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Error when loading path %s", library_path);
	}

	script_paths = plugin_manager_impl_type(manager, loader_manager_impl)->script_paths;

	/* Load the list of script paths (this allows to load multiple paths with a delimiter) */
	if (script_paths != NULL)
	{
		size_t iterator, size = vector_size(script_paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at_type(script_paths, iterator, char *);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to define execution path: %s", plugin_name(p), path);
			}
		}
	}

	paths = set_get(impl->exec_path_map, (const set_key)plugin_name(p));

	/* Load all execution paths (those are the delayed loading for the paths that has been defined before initializing the loader) */
	if (paths != NULL)
	{
		size_t iterator, size = vector_size(paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at(paths, iterator);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to load path: %s", plugin_name(p), path);
			}
		}
	}

	return 0;
}